

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ValuedAction __thiscall despot::Parser::ComputeMaxRewardAction(Parser *this)

{
  uint uVar1;
  int iVar2;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  double extraout_XMM0_Qa;
  ValuedAction VVar7;
  Parser *local_48;
  double local_40;
  int local_34;
  double dStack_30;
  int r;
  double reward;
  Parser *pPStack_20;
  int a;
  Parser *this_local;
  ValuedAction max;
  
  pPStack_20 = this;
  ValuedAction::ValuedAction((ValuedAction *)&this_local,-1,-INFINITY);
  reward._4_4_ = 0;
  while( true ) {
    uVar1 = reward._4_4_;
    pvVar3 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->action_vars_,0);
    iVar2 = Variable::Size(&pvVar3->super_Variable);
    if (iVar2 <= (int)uVar1) break;
    dStack_30 = 0.0;
    local_34 = 0;
    while( true ) {
      uVar4 = (ulong)local_34;
      sVar5 = std::vector<despot::Function,_std::allocator<despot::Function>_>::size
                        (&this->reward_funcs_);
      if (sVar5 <= uVar4) break;
      pvVar6 = std::vector<despot::Function,_std::allocator<despot::Function>_>::operator[]
                         (&this->reward_funcs_,(long)local_34);
      pvVar3 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                         (&this->action_vars_,0);
      (*pvVar6->_vptr_Function[10])(pvVar6,pvVar3,(ulong)reward._4_4_);
      dStack_30 = extraout_XMM0_Qa + dStack_30;
      local_34 = local_34 + 1;
    }
    if ((double)max._0_8_ < dStack_30) {
      ValuedAction::ValuedAction((ValuedAction *)&local_48,reward._4_4_,dStack_30);
      this_local = local_48;
      max._0_8_ = local_40;
    }
    reward._4_4_ = reward._4_4_ + 1;
  }
  VVar7._0_8_ = (ulong)this_local & 0xffffffff;
  VVar7.value = (double)max._0_8_;
  return VVar7;
}

Assistant:

ValuedAction Parser::ComputeMaxRewardAction() const {
	ValuedAction max(-1, Globals::NEG_INFTY);
	for (int a = 0; a < action_vars_[0].Size(); a++) {
		double reward = 0;
		for (int r = 0; r < reward_funcs_.size(); r++) {
			reward += reward_funcs_[r].ComputeConstrainedMaximum(
				&action_vars_[0], a);
		}
		if (reward > max.value) {
			max = ValuedAction(a, reward);
		}
	}
	return max;
}